

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall
Parser::createFunctionNode
          (Parser *this,Token *t,Node *optional_name,Node *parameters_list,Node *function_body)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  iterator iVar3;
  Node *this_00;
  vector<Node_*,_std::allocator<Node_*>_> *this_01;
  Node *local_38;
  Node *local_30;
  Node *local_28;
  
  local_38 = function_body;
  local_30 = parameters_list;
  local_28 = optional_name;
  this_00 = (Node *)operator_new(0x30);
  CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
  this_00->tok = t;
  this_01 = &this_00->children;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->nodeType = PNT_FUNCTION;
  ppNVar2 = (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar2 == (pointer)0x0) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this_01,(iterator)0x0,&local_28);
  }
  else {
    *ppNVar2 = local_28;
    pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  iVar3._M_current =
       (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this_01,iVar3,&local_30);
  }
  else {
    *iVar3._M_current = local_30;
    pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  iVar3._M_current =
       (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this_01,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = local_38;
    pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return this_00;
}

Assistant:

Node * createFunctionNode(Token & t, Node * optional_name, Node * parameters_list, Node * function_body)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FUNCTION;
    n->children.push_back(optional_name);
    n->children.push_back(parameters_list);
    n->children.push_back(function_body);
    return n;
  }